

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

int http_conn_set_error(nng_http *conn,nng_http_status status,char *reason,char *body,char *redirect
                       )

{
  nni_http_entity *pnVar1;
  long lVar2;
  nng_err nVar3;
  anon_struct_16_2_3ef68a38 *extraout_RAX;
  anon_struct_16_2_3ef68a38 *paVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  nng_http_res *pnVar8;
  size_t sVar9;
  char *__s;
  char local_448 [8];
  char content [1024];
  
  conn->iserr = true;
  nni_http_set_status(conn,status,reason);
  __s = conn->rsn;
  paVar4 = extraout_RAX;
  if (__s == (char *)0x0) {
    if (conn->code == NNG_HTTP_STATUS_OK) {
      paVar4 = nni_http_reason::http_status;
    }
    else {
      __s = "Unknown HTTP Status";
      paVar4 = nni_http_reason::http_status;
      lVar2 = 0;
      do {
        lVar7 = lVar2;
        if (lVar7 + 0x10 == 0x3a0) goto LAB_0013677c;
        lVar2 = lVar7 + 0x10;
      } while (*(nng_http_status *)((long)&nni_http_reason::http_status[1].code + lVar7) !=
               conn->code);
      paVar4 = (anon_struct_16_2_3ef68a38 *)(lVar7 + 0x159530);
    }
    __s = paVar4->mesg;
  }
LAB_0013677c:
  nVar3 = (nng_err)paVar4;
  if (body == (char *)0x0) {
    body = local_448;
    snprintf(body,0x400,
             "<!DOCTYPE html>\n<html><head><title>%d %s</title>\n<style>body { font-family: Arial, sans serif; text-align: center }\nh1 { font-size: 36px; }span { background-color: gray; color: white; padding: 7px; border-radius: 5px }h2 { font-size: 24px; }p { font-size: 20px; }</style></head><body><p>&nbsp;</p><h1><span>%d</span></h1><h2>%s</h2><p>"
             ,(ulong)status,__s,(ulong)status,__s);
    sVar5 = strlen(body);
    sVar9 = 0x400 - sVar5;
    if (redirect != (char *)0x0) {
      sVar6 = strlen(redirect);
      if ((sVar6 < 0xc9) || (sVar6 = strlen(__s), 0x27 < sVar6)) {
        snprintf(local_448 + sVar5,sVar9,
                 "You should be automatically redirected to <a href=\"%s\">%s</a>.",redirect,
                 redirect);
      }
      else {
        snprintf(local_448 + sVar5,sVar9,"You should be automatically redirected.");
      }
      sVar9 = strlen(local_448);
      sVar9 = 0x400 - sVar9;
    }
    sVar5 = strlen(body);
    nVar3 = snprintf(local_448 + sVar5,sVar9,"%s","</p></body></html>");
  }
  if (*body != '\0') {
    pnVar8 = &conn->res;
    if (conn->client != false) {
      pnVar8 = (nng_http_res *)&conn->req;
    }
    builtin_strncpy(pnVar1->ctype,"text/html; charset=UTF-8",0x19);
    pnVar1 = &pnVar8->data;
    nni_http_set_static_header
              (conn,&(pnVar8->data).content_type,"Content-Type",(pnVar8->data).ctype);
    sVar5 = strlen(body);
    nVar3 = nni_http_copy_body(conn,body,sVar5);
  }
  return nVar3;
}

Assistant:

static int
http_conn_set_error(nng_http *conn, nng_http_status status, const char *reason,
    const char *body, const char *redirect)
{
	char        content[1024];
	const char *prefix = "<!DOCTYPE html>\n"
	                     "<html><head><title>%d %s</title>\n"
	                     "<style>"
	                     "body { font-family: Arial, sans serif; "
	                     "text-align: center }\n"
	                     "h1 { font-size: 36px; }"
	                     "span { background-color: gray; color: white; "
	                     "padding: 7px; "
	                     "border-radius: 5px }"
	                     "h2 { font-size: 24px; }"
	                     "p { font-size: 20px; }"
	                     "</style></head>"
	                     "<body><p>&nbsp;</p>"
	                     "<h1><span>%d</span></h1>"
	                     "<h2>%s</h2><p>";
	const char *suffix = "</p></body></html>";

	conn->iserr = true;

	nni_http_set_status(conn, status, reason);
	reason = nni_http_get_reason(conn);

	if (body == NULL) {
		snprintf(content, sizeof(content), prefix, status, reason,
		    status, reason);
		size_t avail = sizeof(content) - strlen(content);

		if (redirect != NULL && strlen(redirect) > 200 &&
		    strlen(reason) < 40) {
			// URL is too long for buffer and unlikely to be useful
			// to humans anyway.  600 bytes will fit in the 1K
			// buffer without issue.  (Our prelude and trailer are
			// less than 400 bytes.)
			snprintf(content + strlen(content), avail,
			    "You should be automatically redirected.");
			avail = sizeof(content) - strlen(content);
		} else if (redirect != NULL) {
			// TODO: redirect should be URL encoded.
			snprintf(content + strlen(content), avail,
			    "You should be automatically redirected to <a "
			    "href=\"%s\">%s</a>.",
			    redirect, redirect);
			avail = sizeof(content) - strlen(content);
		}
		snprintf(content + strlen(content), avail, "%s", suffix);
		body = content;
	}
	if (strlen(body) > 0) {
		nni_http_set_content_type(conn, "text/html; charset=UTF-8");
		// if the follow fails, live with it (ENOMEM, so no body).
		(void) nni_http_copy_body(conn, body, strlen(body));
	}
	return (0);
}